

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O3

void __thiscall CCoinsViewDB::ResizeCache(CCoinsViewDB *this,size_t new_cache_size)

{
  CDBWrapper *this_00;
  pointer __p;
  long in_FS_OFFSET;
  __uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_db_params).memory_only == false) {
    std::__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset
              ((__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_> *)&this->m_db,
               (pointer)0x0);
    (this->m_db_params).cache_bytes = new_cache_size;
    (this->m_db_params).wipe_data = false;
    this_00 = (CDBWrapper *)operator_new(0x70);
    CDBWrapper::CDBWrapper(this_00,&this->m_db_params);
    local_30._M_t.super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
    super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
         (tuple<CDBWrapper_*,_std::default_delete<CDBWrapper>_>)
         (_Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>)0x0;
    std::__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset
              ((__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_> *)&this->m_db,this_00)
    ;
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr
              ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewDB::ResizeCache(size_t new_cache_size)
{
    // We can't do this operation with an in-memory DB since we'll lose all the coins upon
    // reset.
    if (!m_db_params.memory_only) {
        // Have to do a reset first to get the original `m_db` state to release its
        // filesystem lock.
        m_db.reset();
        m_db_params.cache_bytes = new_cache_size;
        m_db_params.wipe_data = false;
        m_db = std::make_unique<CDBWrapper>(m_db_params);
    }
}